

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  i64 iFirst;
  char *pCsr;
  i64 local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)((long)ctx + 0x18);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  *(int *)(lVar2 + (long)iPhrase * 0x30) = pExpr->pPhrase->nToken;
  iVar1 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_30);
  if (local_30 != (char *)0x0) {
    lVar2 = lVar2 + (long)iPhrase * 0x30;
    local_38 = 0;
    *(char **)(lVar2 + 8) = local_30;
    fts3GetDeltaPosition(&local_30,&local_38);
    if (local_38 < 0) {
      iVar1 = 0x10b;
    }
    else {
      *(char **)(lVar2 + 0x18) = local_30;
      *(char **)(lVar2 + 0x28) = local_30;
      *(i64 *)(lVar2 + 0x10) = local_38;
      *(i64 *)(lVar2 + 0x20) = local_38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    i64 iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    if( iFirst<0 ){
      rc = FTS_CORRUPT_VTAB;
    }else{
      pPhrase->pHead = pCsr;
      pPhrase->pTail = pCsr;
      pPhrase->iHead = iFirst;
      pPhrase->iTail = iFirst;
    }
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0
    ));
  }

  return rc;
}